

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoderTests.cpp
# Opt level: O0

int testOneHotEncoderBasic(void)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_1e1;
  string local_1e0;
  OneHotEncoder local_1c0;
  FeatureType local_1a8;
  allocator<char> local_191;
  string local_190;
  Result local_170;
  allocator<char> local_141;
  string local_140;
  OneHotEncoder local_120;
  undefined4 local_104;
  FeatureType local_100;
  allocator<char> local_e9;
  string local_e8;
  Result local_c8;
  allocator<char> local_99;
  string local_98;
  OneHotEncoder local_78;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  OneHotEncoder ohe;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  CoreML::OneHotEncoder::OneHotEncoder((OneHotEncoder *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
  CoreML::OneHotEncoder::OneHotEncoder(&local_78,&local_98);
  CoreML::OneHotEncoder::operator=((OneHotEncoder *)local_28,&local_78);
  CoreML::OneHotEncoder::~OneHotEncoder(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Int64",&local_e9);
  CoreML::FeatureType::Int64();
  CoreML::OneHotEncoder::addInput(&local_c8,(OneHotEncoder *)local_28,&local_e8,&local_100);
  bVar1 = CoreML::Result::good(&local_c8);
  CoreML::Result::~Result(&local_c8);
  CoreML::FeatureType::~FeatureType(&local_100);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"",&local_141);
    CoreML::OneHotEncoder::OneHotEncoder(&local_120,&local_140);
    CoreML::OneHotEncoder::operator=((OneHotEncoder *)local_28,&local_120);
    CoreML::OneHotEncoder::~OneHotEncoder(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"String",&local_191);
    CoreML::FeatureType::String();
    CoreML::OneHotEncoder::addInput(&local_170,(OneHotEncoder *)local_28,&local_190,&local_1a8);
    bVar1 = CoreML::Result::good(&local_170);
    CoreML::Result::~Result(&local_170);
    CoreML::FeatureType::~FeatureType(&local_1a8);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"",&local_1e1);
      CoreML::OneHotEncoder::OneHotEncoder(&local_1c0,&local_1e0);
      CoreML::OneHotEncoder::operator=((OneHotEncoder *)local_28,&local_1c0);
      CoreML::OneHotEncoder::~OneHotEncoder(&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      ohe.super_Model.m_spec.
      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ._4_4_ = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/OneHotEncoderTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x17);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(ohe.addInput(\"String\", FeatureType::String())).good()");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      ohe.super_Model.m_spec.
      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ._4_4_ = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/OneHotEncoderTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x14);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"(ohe.addInput(\"Int64\", FeatureType::Int64())).good()");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    ohe.super_Model.m_spec.
    super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
  }
  local_104 = 1;
  CoreML::OneHotEncoder::~OneHotEncoder((OneHotEncoder *)local_28);
  return ohe.super_Model.m_spec.
         super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi._4_4_;
}

Assistant:

int testOneHotEncoderBasic() {
    OneHotEncoder ohe;

    /* Asserts that the type provided is allowed as a feature type by a new
     one hot encoder appended to a model asset named "a". */
    ohe = OneHotEncoder();
    ML_ASSERT_GOOD(ohe.addInput("Int64", FeatureType::Int64()));

    ohe = OneHotEncoder();
    ML_ASSERT_GOOD(ohe.addInput("String", FeatureType::String()));

    /* Asserts that the type provided is not allowed as a feature type by a new
     one hot encoder. */
    ohe = OneHotEncoder();

    /*
    Result r;
    ML_ASSERT_GOOD(r = ohe.addInput("Double", FeatureType::Double()));
    ML_ASSERT_EQ(r.type(), ResultType::FEATURE_TYPE_INVARIANT_VIOLATION);
    
    r = ohe.addInput("Image", FeatureType::Image());
    ML_ASSERT_EQ(r.type(), ResultType::FEATURE_TYPE_INVARIANT_VIOLATION);
    
    r = ohe.addInput("Array", FeatureType::Array({2,3}));
    ML_ASSERT_EQ(r.type(), ResultType::FEATURE_TYPE_INVARIANT_VIOLATION);
                     
    r = ohe.addInput("Dictionary", FeatureType::Dictionary(MLTypeInt64));
    ML_ASSERT_EQ(r.type(), ResultType::FEATURE_TYPE_INVARIANT_VIOLATION);
    */
    
    /* Asserts that the TYPE provided is generally allowed as a feature type by a
     new one hot encoder, but has a type mismatch if that one hot encoder is added
     to the existing model asset "a". */
    /*
    ohe = OneHotEncoder();
    ML_ASSERT_GOOD(ohe.addInput("String", FeatureType::String()));
    */

    /* however, this one should still work, since it doesn't modify the type
     * (since the underlying data is already in one-hot encoding, it's probably
     * a no-op, but that's a decision for the execution engine and not the model
     * serialization -- at this point in time, it's moot, as long as the types
     * match). */
    /*
    ohe = OneHotEncoder();
    ML_ASSERT_GOOD(ohe.addInput("Int64", FeatureType::Int64()));
    */

    return 0;
}